

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O2

Hop_Obj_t * Abc_ObjHopFromGia_rec(Hop_Man_t *pHopMan,Gia_Man_t *p,int Id,Vec_Ptr_t *vCopies)

{
  uint uVar1;
  Hop_Obj_t *pHVar2;
  Gia_Obj_t *pGVar3;
  Hop_Obj_t *pHVar4;
  
  if (p->nTravIdsAlloc <= Id) {
    __assert_fail("Id < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x267,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
  }
  if (p->pTravIds[Id] == p->nTravIds) {
    pHVar2 = (Hop_Obj_t *)Vec_PtrEntry(vCopies,Id);
    return pHVar2;
  }
  Gia_ObjSetTravIdCurrentId(p,Id);
  pGVar3 = Gia_ManObj(p,Id);
  uVar1 = (uint)*(undefined8 *)pGVar3;
  if ((-1 < (int)uVar1) && ((uVar1 & 0x1fffffff) != 0x1fffffff)) {
    pHVar2 = Abc_ObjHopFromGia_rec(pHopMan,p,Id - (uVar1 & 0x1fffffff),vCopies);
    pHVar4 = Abc_ObjHopFromGia_rec
                       (pHopMan,p,Id - (*(uint *)&pGVar3->field_0x4 & 0x1fffffff),vCopies);
    pHVar2 = Hop_And(pHopMan,(Hop_Obj_t *)
                             ((ulong)((uint)(*(ulong *)pGVar3 >> 0x1d) & 1) ^ (ulong)pHVar2),
                     (Hop_Obj_t *)((ulong)((uint)(*(ulong *)pGVar3 >> 0x3d) & 1) ^ (ulong)pHVar4));
    Vec_PtrWriteEntry(vCopies,Id,pHVar2);
    return pHVar2;
  }
  __assert_fail("Gia_ObjIsAnd(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                ,0x2a9,
                "Hop_Obj_t *Abc_ObjHopFromGia_rec(Hop_Man_t *, Gia_Man_t *, int, Vec_Ptr_t *)");
}

Assistant:

Hop_Obj_t * Abc_ObjHopFromGia_rec( Hop_Man_t * pHopMan, Gia_Man_t * p, int Id, Vec_Ptr_t * vCopies )
{
    Gia_Obj_t * pObj;
    Hop_Obj_t * gFunc, * gFunc0, * gFunc1;
    if ( Gia_ObjIsTravIdCurrentId(p, Id) )
        return (Hop_Obj_t *)Vec_PtrEntry( vCopies, Id );
    Gia_ObjSetTravIdCurrentId(p, Id);
    pObj = Gia_ManObj(p, Id);
    assert( Gia_ObjIsAnd(pObj) );
    // compute the functions of the children
    gFunc0 = Abc_ObjHopFromGia_rec( pHopMan, p, Gia_ObjFaninId0(pObj, Id), vCopies );
    gFunc1 = Abc_ObjHopFromGia_rec( pHopMan, p, Gia_ObjFaninId1(pObj, Id), vCopies );
    // get the function of the cut
    gFunc  = Hop_And( pHopMan, Hop_NotCond(gFunc0, Gia_ObjFaninC0(pObj)), Hop_NotCond(gFunc1, Gia_ObjFaninC1(pObj)) );  
    Vec_PtrWriteEntry( vCopies, Id, gFunc );
    return gFunc;
}